

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msaa.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  uint value;
  undefined8 in_RAX;
  GLFWwindow *handle;
  double dVar2;
  undefined8 local_38;
  
  value = 4;
  local_38 = in_RAX;
  while( true ) {
    iVar1 = getopt(argc,argv,"hs:");
    if (iVar1 != 0x73) break;
    value = atoi(optarg);
  }
  if (iVar1 == -1) {
    local_38 = CONCAT44(value,(GLfloat)local_38);
    glfwSetErrorCallback(error_callback);
    iVar1 = glfwInit();
    if (iVar1 != 0) {
      if (value == 0) {
        puts("Requesting that MSAA not be available");
      }
      else {
        printf("Requesting MSAA with %i samples\n",(ulong)value);
      }
      glfwWindowHint(0x2100d,value);
      glfwWindowHint(0x20004,0);
      handle = glfwCreateWindow(800,400,"Aliasing Detector",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
      if (handle != (GLFWwindow *)0x0) {
        glfwSetKeyCallback(handle,key_callback);
        glfwSetFramebufferSizeCallback(handle,framebuffer_size_callback);
        glfwMakeContextCurrent(handle);
        gladLoadGLLoader(glfwGetProcAddress);
        glfwSwapInterval(1);
        if (GLAD_GL_VERSION_1_3 != 0 || GLAD_GL_ARB_multisample != 0) {
          glfwShowWindow(handle);
          (*glad_glGetIntegerv)(0x80a9,(GLint *)((long)&local_38 + 4));
          if (local_38._4_4_ == 0) {
            puts("Context reports MSAA is unavailable");
          }
          else {
            printf("Context reports MSAA is available with %i samples\n");
          }
          (*glad_glMatrixMode)(0x1701);
          (*glad_glOrtho)(0.0,1.0,0.0,0.5,0.0,1.0);
          (*glad_glMatrixMode)(0x1700);
          while( true ) {
            iVar1 = glfwWindowShouldClose(handle);
            if (iVar1 != 0) break;
            dVar2 = glfwGetTime();
            local_38 = CONCAT44(local_38._4_4_,(float)dVar2);
            (*glad_glClear)(0x4000);
            (*glad_glLoadIdentity)();
            (*glad_glTranslatef)(0.25,0.25,0.0);
            (*glad_glRotatef)((GLfloat)local_38,0.0,0.0,1.0);
            (*glad_glDisable)(0x809d);
            (*glad_glRectf)(-0.15,-0.15,0.15,0.15);
            (*glad_glLoadIdentity)();
            (*glad_glTranslatef)(0.75,0.25,0.0);
            (*glad_glRotatef)((GLfloat)local_38,0.0,0.0,1.0);
            (*glad_glEnable)(0x809d);
            (*glad_glRectf)(-0.15,-0.15,0.15,0.15);
            glfwSwapBuffers(handle);
            glfwPollEvents();
          }
          glfwTerminate();
          goto LAB_00110bfb;
        }
        puts("Multisampling is not supported");
      }
      glfwTerminate();
    }
  }
  else {
    if (iVar1 == 0x68) {
      usage();
LAB_00110bfb:
      exit(0);
    }
    usage();
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int ch, samples = 4;
    GLFWwindow* window;

    while ((ch = getopt(argc, argv, "hs:")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);
            case 's':
                samples = atoi(optarg);
                break;
            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    if (samples)
        printf("Requesting MSAA with %i samples\n", samples);
    else
        printf("Requesting that MSAA not be available\n");

    glfwWindowHint(GLFW_SAMPLES, samples);
    glfwWindowHint(GLFW_VISIBLE, GLFW_FALSE);

    window = glfwCreateWindow(800, 400, "Aliasing Detector", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwSetKeyCallback(window, key_callback);
    glfwSetFramebufferSizeCallback(window, framebuffer_size_callback);

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    glfwSwapInterval(1);

    if (!GLAD_GL_ARB_multisample && !GLAD_GL_VERSION_1_3)
    {
        printf("Multisampling is not supported\n");

        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwShowWindow(window);

    glGetIntegerv(GL_SAMPLES, &samples);
    if (samples)
        printf("Context reports MSAA is available with %i samples\n", samples);
    else
        printf("Context reports MSAA is unavailable\n");

    glMatrixMode(GL_PROJECTION);
    glOrtho(0.f, 1.f, 0.f, 0.5f, 0.f, 1.f);
    glMatrixMode(GL_MODELVIEW);

    while (!glfwWindowShouldClose(window))
    {
        GLfloat time = (GLfloat) glfwGetTime();

        glClear(GL_COLOR_BUFFER_BIT);

        glLoadIdentity();
        glTranslatef(0.25f, 0.25f, 0.f);
        glRotatef(time, 0.f, 0.f, 1.f);

        glDisable(GL_MULTISAMPLE_ARB);
        glRectf(-0.15f, -0.15f, 0.15f, 0.15f);

        glLoadIdentity();
        glTranslatef(0.75f, 0.25f, 0.f);
        glRotatef(time, 0.f, 0.f, 1.f);

        glEnable(GL_MULTISAMPLE_ARB);
        glRectf(-0.15f, -0.15f, 0.15f, 0.15f);

        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}